

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::error_or<std::__cxx11::string>::error_or<char_const(&)[2],void>
          (error_or<std::__cxx11::string> *this,char (*other) [2])

{
  char (*pacVar1) [2];
  storage_type *this_00;
  allocator local_19;
  char (*local_18) [2];
  char (*other_local) [2];
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this[0x20] = (error_or<std::__cxx11::string>)0x0;
  local_18 = other;
  other_local = (char (*) [2])this;
  this_00 = error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::get_storage((error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)this);
  pacVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,*pacVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return;
}

Assistant:

explicit error_or (Other && other)
                : has_error_{false} {
            new (get_storage ()) storage_type (std::forward<Other> (other));
        }